

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

enable_if_t<_detail::move_never<InitialState<>_>::value,_InitialState<>_> * __thiscall
pybind11::move<InitialState<double>>
          (enable_if_t<_detail::move_never<InitialState<>_>::value,_InitialState<>_>
           *__return_storage_ptr__,pybind11 *this,object *obj)

{
  itype *piVar1;
  cast_error *this_00;
  handle local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (**(int **)this < 2) {
    detail::load_type<InitialState<double>>
              ((make_caster<InitialState<>_> *)&local_e0,(detail *)this,&obj->super_handle);
    piVar1 = detail::type_caster_base::operator_cast_to_InitialState_((type_caster_base *)&local_e0)
    ;
    InitialState<double>::InitialState(__return_storage_ptr__,piVar1);
    return __return_storage_ptr__;
  }
  this_00 = (cast_error *)__cxa_allocate_exception(0x10);
  local_e8.m_ptr = (PyObject *)PyObject_Str(*(undefined8 *)(*(long *)this + 8));
  str::operator_cast_to_string(&local_a0,(str *)&local_e8);
  std::operator+(&local_80,"Unable to move from Python ",&local_a0);
  std::operator+(&local_60,&local_80," instance to C++ ");
  type_id<InitialState<double>>();
  std::operator+(&local_40,&local_60,&local_c0);
  std::operator+(&local_e0,&local_40," instance: instance has multiple references");
  cast_error::runtime_error(this_00,&local_e0);
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

detail::enable_if_t<!detail::move_never<T>::value, T> move(object &&obj) {
    if (obj.ref_count() > 1)
#if defined(NDEBUG)
        throw cast_error("Unable to cast Python instance to C++ rvalue: instance has multiple references"
            " (compile in debug mode for details)");
#else
        throw cast_error("Unable to move from Python " + (std::string) str(obj.get_type()) +
                " instance to C++ " + type_id<T>() + " instance: instance has multiple references");
#endif

    // Move into a temporary and return that, because the reference may be a local value of `conv`
    T ret = std::move(detail::load_type<T>(obj).operator T&());
    return ret;
}